

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_ErrorsReportedToLogError_Test::TestBody
          (ValidationErrorTest_ErrorsReportedToLogError_Test *this)

{
  internal iVar1;
  FileDescriptor *pFVar2;
  Message *in_RCX;
  pointer *__ptr_1;
  char *in_R9;
  pointer *__ptr;
  string_view input;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  ScopedMockLog log;
  FileDescriptorProto file_proto;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_2a8;
  undefined1 local_290 [8];
  VTable *local_288;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_278;
  undefined1 local_260 [8];
  undefined1 local_258 [24];
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_240;
  MatcherBase<absl::lts_20250127::LogSeverity> local_228;
  undefined1 local_210 [240];
  FileDescriptorProto local_120;
  
  FileDescriptorProto::FileDescriptorProto(&local_120,(Arena *)0x0);
  input._M_str = (char *)&local_120;
  input._M_len = (size_t)
                 "name: \"foo.proto\" message_type { name: \"Foo\" } message_type { name: \"Foo\" } "
  ;
  iVar1 = (internal)TextFormat::ParseFromString((TextFormat *)0x4c,input,in_RCX);
  local_258._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_260[0] = iVar1;
  if (!(bool)iVar1) {
    testing::Message::Message((Message *)local_290);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_210,(internal *)local_260,
               (AssertionResult *)
               "TextFormat::ParseFromString(\"name: \\\"foo.proto\\\" \" \"message_type { name: \\\"Foo\\\" } \" \"message_type { name: \\\"Foo\\\" } \", &file_proto)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2a8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1b47,(char *)local_210._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2a8,(Message *)local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2a8);
    if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
      operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
    }
    if ((long *)CONCAT71(local_290._1_7_,local_290[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_290._1_7_,local_290[0]) + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_258,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_258._0_8_);
    }
    if (!(bool)iVar1) goto LAB_0059dba0;
  }
  absl::lts_20250127::ScopedMockLog::ScopedMockLog((ScopedMockLog *)local_210,kDisallowUnexpected);
  testing::Matcher<absl::lts_20250127::LogSeverity>::Matcher
            ((Matcher<absl::lts_20250127::LogSeverity> *)local_290,kError);
  local_2a8.buffer_.ptr = (void *)0x0;
  local_2a8.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<std::__cxx11::string_const&>::
       GetVTable<testing::internal::MatcherBase<std::__cxx11::string_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable_abi_cxx11_;
  local_2a8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_018cdbe0;
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *)&local_278,"Invalid proto descriptor for file \"foo.proto\":");
  absl::lts_20250127::ScopedMockLog::gmock_Log
            ((MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)local_260,(ScopedMockLog *)local_210,
             (Matcher<absl::lts_20250127::LogSeverity> *)local_290,
             (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_2a8,
             (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_278);
  testing::internal::GetWithoutMatchers();
  testing::internal::
  MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::InternalExpectedAt
            ((MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)local_260,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
             ,0x1b4b,"log",
             "Log(absl::LogSeverity::kError, testing::_, \"Invalid proto descriptor for file \\\"foo.proto\\\":\")"
            );
  testing::internal::MatcherBase<absl::lts_20250127::LogSeverity>::~MatcherBase(&local_228);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_240);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)local_258);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_278);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_2a8);
  testing::internal::MatcherBase<absl::lts_20250127::LogSeverity>::~MatcherBase
            ((MatcherBase<absl::lts_20250127::LogSeverity> *)local_290);
  testing::Matcher<absl::lts_20250127::LogSeverity>::Matcher
            ((Matcher<absl::lts_20250127::LogSeverity> *)local_290,kError);
  local_2a8.buffer_.ptr = (void *)0x0;
  local_2a8.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<std::__cxx11::string_const&>::
       GetVTable<testing::internal::MatcherBase<std::__cxx11::string_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable_abi_cxx11_;
  local_2a8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_018cdbe0;
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *)&local_278,"  Foo: \"Foo\" is already defined.");
  absl::lts_20250127::ScopedMockLog::gmock_Log
            ((MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)local_260,(ScopedMockLog *)local_210,
             (Matcher<absl::lts_20250127::LogSeverity> *)local_290,
             (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_2a8,
             (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_278);
  testing::internal::GetWithoutMatchers();
  testing::internal::
  MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::InternalExpectedAt
            ((MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)local_260,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
             ,0x1b4d,"log",
             "Log(absl::LogSeverity::kError, testing::_, \"  Foo: \\\"Foo\\\" is already defined.\")"
            );
  testing::internal::MatcherBase<absl::lts_20250127::LogSeverity>::~MatcherBase(&local_228);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_240);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase((MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)local_258);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_278);
  testing::internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_2a8);
  testing::internal::MatcherBase<absl::lts_20250127::LogSeverity>::~MatcherBase
            ((MatcherBase<absl::lts_20250127::LogSeverity> *)local_290);
  absl::lts_20250127::ScopedMockLog::StartCapturingLogs((ScopedMockLog *)local_210);
  pFVar2 = DescriptorPool::BuildFile(&(this->super_ValidationErrorTest).pool_,&local_120);
  local_290[0] = (internal)(pFVar2 == (FileDescriptor *)0x0);
  local_288 = (VTable *)0x0;
  if (!(bool)local_290[0]) {
    testing::Message::Message((Message *)&local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_260,(internal *)local_290,
               (AssertionResult *)"pool_.BuildFile(file_proto) == nullptr","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1b4f,(char *)CONCAT71(local_260._1_7_,local_260[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_278,(Message *)&local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_278);
    if ((undefined1 *)CONCAT71(local_260._1_7_,local_260[0]) != local_258 + 8) {
      operator_delete((undefined1 *)CONCAT71(local_260._1_7_,local_260[0]),
                      (ulong)(local_258._8_8_ + 1));
    }
    if (local_2a8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
        (_func_int **)0x0) {
      (**(code **)(*local_2a8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 8))
                ();
    }
  }
  if (local_288 != (VTable *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_288,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288);
  }
  absl::lts_20250127::ScopedMockLog::~ScopedMockLog((ScopedMockLog *)local_210);
LAB_0059dba0:
  FileDescriptorProto::~FileDescriptorProto(&local_120);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ErrorsReportedToLogError) {
  // Test that errors are reported to ABSL_LOG(ERROR) if no error collector is
  // provided.

  FileDescriptorProto file_proto;
  ASSERT_TRUE(
      TextFormat::ParseFromString("name: \"foo.proto\" "
                                  "message_type { name: \"Foo\" } "
                                  "message_type { name: \"Foo\" } ",
                                  &file_proto));
  {
    absl::ScopedMockLog log(absl::MockLogDefault::kDisallowUnexpected);
    EXPECT_CALL(log, Log(absl::LogSeverity::kError, testing::_,
                         "Invalid proto descriptor for file \"foo.proto\":"));
    EXPECT_CALL(log, Log(absl::LogSeverity::kError, testing::_,
                         "  Foo: \"Foo\" is already defined."));
    log.StartCapturingLogs();
    EXPECT_TRUE(pool_.BuildFile(file_proto) == nullptr);
  }
}